

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceMappingImpl.hpp
# Opt level: O3

void __thiscall
Diligent::ResourceMappingImpl::ResMappingHashKey::ResMappingHashKey
          (ResMappingHashKey *this,Char *Str,bool bMakeCopy,Uint32 ArrInd)

{
  size_t Seed;
  Uint32 local_34;
  ulong local_30;
  size_t local_28;
  
  local_34 = ArrInd;
  HashMapStringKey::HashMapStringKey(&this->super_HashMapStringKey,Str,bMakeCopy);
  this->ArrayIndex = ArrInd;
  local_30 = (this->super_HashMapStringKey).Ownership_Hash & 0x7fffffffffffffff;
  local_28 = 0;
  HashCombine<unsigned_long,unsigned_int>(&local_28,&local_30,&local_34);
  (this->super_HashMapStringKey).Ownership_Hash =
       (this->super_HashMapStringKey).Ownership_Hash & 0x8000000000000000 |
       local_28 & 0x7fffffffffffffff;
  return;
}

Assistant:

ResMappingHashKey(const Char* Str, bool bMakeCopy, Uint32 ArrInd) noexcept :
            HashMapStringKey{Str, bMakeCopy},
            ArrayIndex{ArrInd}
        {
            Ownership_Hash = (ComputeHash(GetHash(), ArrInd) & HashMask) | (Ownership_Hash & StrOwnershipMask);
        }